

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTableLayout.cpp
# Opt level: O0

QSize __thiscall KDReports::TableLayout::decorationSize(TableLayout *this,QVariant *cellDecoration)

{
  byte bVar1;
  undefined1 local_60 [8];
  QPixmap pix;
  undefined1 local_38 [8];
  QImage img;
  QVariant *cellDecoration_local;
  TableLayout *this_local;
  
  qvariant_cast<QImage>((QVariant *)local_38);
  bVar1 = QImage::isNull();
  if ((bVar1 & 1) == 0) {
    this_local = (TableLayout *)QImage::size();
  }
  else {
    qvariant_cast<QPixmap>((QVariant *)local_60);
    bVar1 = QPixmap::isNull();
    if ((bVar1 & 1) == 0) {
      this_local = (TableLayout *)QPixmap::size();
    }
    else {
      this_local = *(TableLayout **)&this->m_iconSize;
    }
    QPixmap::~QPixmap((QPixmap *)local_60);
  }
  QImage::~QImage((QImage *)local_38);
  return (QSize)this_local;
}

Assistant:

QSize KDReports::TableLayout::decorationSize(const QVariant &cellDecoration) const
{
    QImage img = qvariant_cast<QImage>(cellDecoration);
    if (!img.isNull()) {
        return img.size();
    }
    QPixmap pix = qvariant_cast<QPixmap>(cellDecoration);
    if (!pix.isNull()) {
        return pix.size();
    }
    return m_iconSize;
}